

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

ParsedFloat *
absl::strings_internal::ParseFloat<10>
          (ParsedFloat *__return_storage_ptr__,char *begin,char *end,chars_format format_flags)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  chars_format cVar5;
  int iVar6;
  byte *pbVar7;
  uint max_digits;
  long lVar8;
  bool *dropped_nonzero_digit;
  char *pcVar9;
  ulong uVar10;
  byte *begin_00;
  byte *pbVar11;
  char *pcVar12;
  bool mantissa_is_inexact;
  uint64_t mantissa;
  chars_format local_3c;
  ulong local_38;
  
  __return_storage_ptr__->mantissa = 0;
  __return_storage_ptr__->exponent = 0;
  __return_storage_ptr__->literal_exponent = 0;
  __return_storage_ptr__->type = kNumber;
  __return_storage_ptr__->subrange_begin = (char *)0x0;
  __return_storage_ptr__->subrange_end = (char *)0x0;
  __return_storage_ptr__->end = (char *)0x0;
  if (begin == end) {
    return __return_storage_ptr__;
  }
  bVar2 = anon_unknown_0::ParseInfinityOrNan(begin,end,__return_storage_ptr__);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  pcVar9 = begin + 1;
  for (lVar8 = 0; (pcVar12 = begin + lVar8, pcVar12 < end && (*pcVar12 == '0')); lVar8 = lVar8 + 1)
  {
    pcVar9 = pcVar9 + 1;
  }
  mantissa = 0;
  mantissa_is_inexact = false;
  local_3c = format_flags;
  iVar3 = absl::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
                    (pcVar12,end,0x13,&mantissa,&mantissa_is_inexact);
  if (49999999 < iVar3) {
    return __return_storage_ptr__;
  }
  pbVar7 = (byte *)(long)iVar3;
  pbVar11 = (byte *)(pcVar12 + (long)pbVar7);
  dropped_nonzero_digit = (bool *)0x13;
  max_digits = 0x13 - iVar3;
  if (0x13 < iVar3) {
    max_digits = 0;
  }
  local_38 = (ulong)(iVar3 - 0x13);
  if (iVar3 < 0x14) {
    local_38 = 0;
  }
  if ((pbVar11 < end) && (*pbVar11 == 0x2e)) {
    pcVar12 = begin + (long)pbVar7 + lVar8 + 1;
    uVar10 = local_38;
    if (mantissa == 0) {
      pbVar7 = pbVar7 + (long)pcVar9;
      for (; (pcVar9 = end, pcVar12 < end && (pcVar9 = pcVar12, *pcVar12 == '0'));
          pcVar12 = pcVar12 + 1) {
        pbVar7 = pbVar7 + 1;
      }
      if (end < pbVar7) {
        pbVar7 = (byte *)end;
      }
      iVar6 = 0x13;
      if (0x13 < iVar3) {
        iVar6 = iVar3;
      }
      if (49999999 < (int)((~(uint)begin + ((int)pbVar7 - iVar3)) - (int)lVar8)) {
        return __return_storage_ptr__;
      }
      uVar10 = (ulong)((uint)begin - 0x12) + lVar8 + (ulong)(uint)((iVar3 + iVar6) - (int)pbVar7);
      pcVar12 = pcVar9;
    }
    dropped_nonzero_digit = &mantissa_is_inexact;
    uVar4 = absl::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
                      (pcVar12,end,max_digits,&mantissa,dropped_nonzero_digit);
    if ((int)uVar4 < (int)max_digits) {
      max_digits = uVar4;
    }
    pbVar7 = (byte *)(ulong)max_digits;
    if (49999999 < (int)uVar4) {
      return __return_storage_ptr__;
    }
    pbVar11 = (byte *)(pcVar12 + (int)uVar4);
    local_38 = (ulong)((int)uVar10 - max_digits);
  }
  if (pbVar11 == (byte *)begin) {
    return __return_storage_ptr__;
  }
  if (((long)pbVar11 - (long)begin == 1) && (*begin == '.')) {
    return __return_storage_ptr__;
  }
  if (mantissa_is_inexact == true) {
    __return_storage_ptr__->subrange_begin = begin;
    __return_storage_ptr__->subrange_end = (char *)pbVar11;
  }
  __return_storage_ptr__->mantissa = mantissa;
  __return_storage_ptr__->literal_exponent = 0;
  cVar5 = local_3c & general;
  if (((cVar5 != fixed) && (pbVar11 < end)) && ((*pbVar11 & 0xdf) == 0x45)) {
    piVar1 = &__return_storage_ptr__->literal_exponent;
    begin_00 = pbVar11 + 1;
    bVar2 = true;
    if (begin_00 < end) {
      if (*begin_00 == 0x2d) {
        bVar2 = false;
        begin_00 = pbVar11 + 2;
      }
      else {
        pbVar7 = pbVar11 + 2;
        if (*begin_00 == 0x2b) {
          begin_00 = pbVar7;
        }
      }
    }
    iVar6 = absl::(anonymous_namespace)::ConsumeDigits<10,int>
                      ((char *)begin_00,end,(int)piVar1,(int *)pbVar7,dropped_nonzero_digit);
    iVar3 = (int)local_38;
    pbVar7 = begin_00 + iVar6;
    if ((!bVar2) && (iVar6 != 0)) {
      *piVar1 = -*piVar1;
      goto LAB_00252401;
    }
    if (iVar6 != 0) goto LAB_00252401;
  }
  iVar3 = (int)local_38;
  pbVar7 = pbVar11;
  if (cVar5 == scientific) {
    return __return_storage_ptr__;
  }
LAB_00252401:
  __return_storage_ptr__->type = kNumber;
  iVar6 = 0;
  if (__return_storage_ptr__->mantissa != 0) {
    iVar6 = iVar3 + __return_storage_ptr__->literal_exponent;
  }
  __return_storage_ptr__->exponent = iVar6;
  __return_storage_ptr__->end = (char *)pbVar7;
  return __return_storage_ptr__;
}

Assistant:

strings_internal::ParsedFloat ParseFloat(const char* begin, const char* end,
                                         chars_format format_flags) {
  strings_internal::ParsedFloat result;

  // Exit early if we're given an empty range.
  if (begin == end) return result;

  // Handle the infinity and NaN cases.
  if (ParseInfinityOrNan(begin, end, &result)) {
    return result;
  }

  const char* const mantissa_begin = begin;
  while (begin < end && *begin == '0') {
    ++begin;  // skip leading zeros
  }
  uint64_t mantissa = 0;

  int exponent_adjustment = 0;
  bool mantissa_is_inexact = false;
  int pre_decimal_digits = ConsumeDigits<base>(
      begin, end, MantissaDigitsMax<base>(), &mantissa, &mantissa_is_inexact);
  begin += pre_decimal_digits;
  int digits_left;
  if (pre_decimal_digits >= DigitLimit<base>()) {
    // refuse to parse pathological inputs
    return result;
  } else if (pre_decimal_digits > MantissaDigitsMax<base>()) {
    // We dropped some non-fraction digits on the floor.  Adjust our exponent
    // to compensate.
    exponent_adjustment =
        static_cast<int>(pre_decimal_digits - MantissaDigitsMax<base>());
    digits_left = 0;
  } else {
    digits_left =
        static_cast<int>(MantissaDigitsMax<base>() - pre_decimal_digits);
  }
  if (begin < end && *begin == '.') {
    ++begin;
    if (mantissa == 0) {
      // If we haven't seen any nonzero digits yet, keep skipping zeros.  We
      // have to adjust the exponent to reflect the changed place value.
      const char* begin_zeros = begin;
      while (begin < end && *begin == '0') {
        ++begin;
      }
      int zeros_skipped = static_cast<int>(begin - begin_zeros);
      if (zeros_skipped >= DigitLimit<base>()) {
        // refuse to parse pathological inputs
        return result;
      }
      exponent_adjustment -= static_cast<int>(zeros_skipped);
    }
    int post_decimal_digits = ConsumeDigits<base>(
        begin, end, digits_left, &mantissa, &mantissa_is_inexact);
    begin += post_decimal_digits;

    // Since `mantissa` is an integer, each significant digit we read after
    // the decimal point requires an adjustment to the exponent. "1.23e0" will
    // be stored as `mantissa` == 123 and `exponent` == -2 (that is,
    // "123e-2").
    if (post_decimal_digits >= DigitLimit<base>()) {
      // refuse to parse pathological inputs
      return result;
    } else if (post_decimal_digits > digits_left) {
      exponent_adjustment -= digits_left;
    } else {
      exponent_adjustment -= post_decimal_digits;
    }
  }
  // If we've found no mantissa whatsoever, this isn't a number.
  if (mantissa_begin == begin) {
    return result;
  }
  // A bare "." doesn't count as a mantissa either.
  if (begin - mantissa_begin == 1 && *mantissa_begin == '.') {
    return result;
  }

  if (mantissa_is_inexact) {
    // We dropped significant digits on the floor.  Handle this appropriately.
    if (base == 10) {
      // If we truncated significant decimal digits, store the full range of the
      // mantissa for future big integer math for exact rounding.
      result.subrange_begin = mantissa_begin;
      result.subrange_end = begin;
    } else if (base == 16) {
      // If we truncated hex digits, reflect this fact by setting the low
      // ("sticky") bit.  This allows for correct rounding in all cases.
      mantissa |= 1;
    }
  }
  result.mantissa = mantissa;

  const char* const exponent_begin = begin;
  result.literal_exponent = 0;
  bool found_exponent = false;
  if (AllowExponent(format_flags) && begin < end &&
      IsExponentCharacter<base>(*begin)) {
    bool negative_exponent = false;
    ++begin;
    if (begin < end && *begin == '-') {
      negative_exponent = true;
      ++begin;
    } else if (begin < end && *begin == '+') {
      ++begin;
    }
    const char* const exponent_digits_begin = begin;
    // Exponent is always expressed in decimal, even for hexadecimal floats.
    begin += ConsumeDigits<10>(begin, end, kDecimalExponentDigitsMax,
                               &result.literal_exponent, nullptr);
    if (begin == exponent_digits_begin) {
      // there were no digits where we expected an exponent.  We failed to read
      // an exponent and should not consume the 'e' after all.  Rewind 'begin'.
      found_exponent = false;
      begin = exponent_begin;
    } else {
      found_exponent = true;
      if (negative_exponent) {
        result.literal_exponent = -result.literal_exponent;
      }
    }
  }

  if (!found_exponent && RequireExponent(format_flags)) {
    // Provided flags required an exponent, but none was found.  This results
    // in a failure to scan.
    return result;
  }

  // Success!
  result.type = strings_internal::FloatType::kNumber;
  if (result.mantissa > 0) {
    result.exponent = result.literal_exponent +
                      (DigitMagnitude<base>() * exponent_adjustment);
  } else {
    result.exponent = 0;
  }
  result.end = begin;
  return result;
}